

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O1

void select_result(int fd,int event)

{
  void *pvVar1;
  int local_1c;
  
  local_1c = fd;
  pvVar1 = find234(fds,&local_1c,uxsel_fd_findcmp);
  noise_ultralight(NOISE_SOURCE_IOID,(long)local_1c);
  if (pvVar1 != (void *)0x0) {
    (**(code **)((long)pvVar1 + 8))(local_1c,event);
  }
  return;
}

Assistant:

void select_result(int fd, int event)
{
    struct fd *fdstruct = find234(fds, &fd, uxsel_fd_findcmp);

    noise_ultralight(NOISE_SOURCE_IOID, fd);

    /*
     * Apparently this can sometimes be NULL. Can't see how, but I
     * assume it means I need to ignore the event since it's on an
     * fd I've stopped being interested in. Sigh.
     */
    if (fdstruct)
        fdstruct->callback(fd, event);
}